

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O3

N_Vector N_VNew_SensWrapper(int count,N_Vector w)

{
  long *plVar1;
  N_Vector v;
  N_Vector p_Var2;
  long lVar3;
  
  v = N_VNewEmpty_SensWrapper(count);
  if (v == (N_Vector)0x0) {
LAB_00104b79:
    v = (N_Vector)0x0;
  }
  else {
    plVar1 = (long *)v->content;
    if (0 < (int)plVar1[1]) {
      lVar3 = 0;
      do {
        p_Var2 = N_VClone(w);
        *(N_Vector *)(*plVar1 + lVar3 * 8) = p_Var2;
        if (*(long *)(*plVar1 + lVar3 * 8) == 0) {
          N_VDestroy(v);
          goto LAB_00104b79;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)plVar1[1]);
    }
    *(undefined4 *)((long)plVar1 + 0xc) = 1;
  }
  return v;
}

Assistant:

N_Vector N_VNew_SensWrapper(int count, N_Vector w)
{
  N_Vector v;
  int i;

  v = NULL;
  v = N_VNewEmpty_SensWrapper(count);
  if (v == NULL) return(NULL);

  for (i=0; i < NV_NVECS_SW(v); i++) {
    NV_VEC_SW(v,i) = N_VClone(w);
    if (NV_VEC_SW(v,i) == NULL) { N_VDestroy(v); return(NULL); }
  }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  return(v);
}